

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.c
# Opt level: O2

void coda_za_close(za_file *zf)

{
  long lVar1;
  int i;
  long lVar2;
  
  close(zf->fd);
  if (zf->entry != (za_entry *)0x0) {
    lVar1 = 0x28;
    for (lVar2 = 0; lVar2 < zf->num_entries; lVar2 = lVar2 + 1) {
      free(*(void **)((long)&zf->entry->localheader_offset + lVar1));
      lVar1 = lVar1 + 0x38;
    }
    free(zf->entry);
  }
  free(zf->filename);
  if (zf->hash_data != (hashtable *)0x0) {
    coda_hashtable_delete(zf->hash_data);
  }
  free(zf);
  return;
}

Assistant:

void za_close(za_file *zf)
{
    close(zf->fd);
    if (zf->entry != NULL)
    {
        int i;

        for (i = 0; i < zf->num_entries; i++)
        {
            if (zf->entry[i].filename != NULL)
            {
                free(zf->entry[i].filename);
            }
        }
        free(zf->entry);
    }
    if (zf->filename != NULL)
    {
        free(zf->filename);
    }
    if (zf->hash_data != NULL)
    {
        hashtable_delete(zf->hash_data);
    }
    free(zf);
}